

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_line.h
# Opt level: O2

void charls::transform_line<charls::transform_hp1<unsigned_short>,unsigned_short>
               (quad<unsigned_short> *destination,quad<unsigned_short> *source,size_t pixel_count,
               transform_hp1<unsigned_short> *transform,uint32_t mask)

{
  size_t i;
  size_t sVar1;
  uint uVar2;
  
  for (sVar1 = 0; pixel_count != sVar1; sVar1 = sVar1 + 1) {
    uVar2 = source[sVar1].super_triplet<unsigned_short>.field_1.v2 & mask;
    destination[sVar1] =
         (quad<unsigned_short>)
         ((ulong)(source[sVar1].field_0.v4 & mask) << 0x30 |
         (ulong)((source[sVar1].super_triplet<unsigned_short>.field_0.v1 & mask) - uVar2 & 0xffff ^
                0x8000) |
         CONCAT44((source[sVar1].super_triplet<unsigned_short>.field_2.v3 & mask) - uVar2,
                  uVar2 << 0x10) & 0xffffffffffff ^ 0x800000000000);
  }
  return;
}

Assistant:

void transform_line(quad<PixelType>* destination, const quad<PixelType>* source, const size_t pixel_count,
                    Transform& transform, const uint32_t mask) noexcept
{
    for (size_t i{}; i < pixel_count; ++i)
    {
        destination[i] =
            quad<PixelType>(transform(source[i].v1 & mask, source[i].v2 & mask, source[i].v3 & mask), source[i].v4 & mask);
    }
}